

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>_>
::val(value_type *__return_storage_ptr__,
     FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>_>
     *this)

{
  value_type vStack_68;
  value_type local_48;
  FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> local_28;
  
  FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::val
            (&local_48,&this->left_->fadexpr_);
  FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>::val(&vStack_68,&this->right_->fadexpr_);
  local_28.fadexpr_.left_ = &local_48;
  local_28.fadexpr_.right_ = &vStack_68;
  Fad<double>::Fad<FadBinaryDiv<Fad<double>,Fad<double>>>(__return_storage_ptr__,&local_28);
  Fad<double>::~Fad(&vStack_68);
  Fad<double>::~Fad(&local_48);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}